

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Error __thiscall
asmjit::BaseBuilder::_newInstNode
          (BaseBuilder *this,InstNode **out,uint32_t instId,uint32_t instOptions,uint32_t opCount)

{
  Error EVar1;
  InstNode *pIVar2;
  int iVar3;
  
  iVar3 = (uint)(4 < opCount) * 2 + 4;
  pIVar2 = (InstNode *)ZoneAllocator::alloc(&this->_allocator,(ulong)(iVar3 * 0x10 + 0x40));
  if (pIVar2 != (InstNode *)0x0) {
    (pIVar2->super_BaseNode).field_0.field_0._prev = (BaseNode *)0x0;
    (pIVar2->super_BaseNode).field_0.field_0._next = (BaseNode *)0x0;
    (pIVar2->super_BaseNode).field_1._any._nodeType = '\x01';
    (pIVar2->super_BaseNode).field_1._any._nodeFlags = (byte)this->_nodeFlags | 0x29;
    *(undefined8 *)&(pIVar2->super_BaseNode)._position = 0;
    *(undefined8 *)((long)&(pIVar2->super_BaseNode).field_3 + 4) = 0;
    (pIVar2->super_BaseNode)._passData = (void *)0x0;
    (pIVar2->super_BaseNode)._inlineComment = (char *)0x0;
    (pIVar2->_baseInst)._id = instId;
    (pIVar2->_baseInst)._options = instOptions;
    (pIVar2->_baseInst)._extraReg._signature = 0;
    (pIVar2->_baseInst)._extraReg._id = 0;
    (pIVar2->super_BaseNode).field_1._any._reserved1 = (uint8_t)iVar3;
    (pIVar2->super_BaseNode).field_1._any._reserved0 = (uint8_t)opCount;
    *out = pIVar2;
    return 0;
  }
  EVar1 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
  return EVar1;
}

Assistant:

Error BaseBuilder::_newInstNode(InstNode** out, uint32_t instId, uint32_t instOptions, uint32_t opCount) {
  uint32_t opCapacity = InstNode::capacityOfOpCount(opCount);
  ASMJIT_ASSERT(opCapacity >= InstNode::kBaseOpCapacity);

  InstNode* node = _allocator.allocT<InstNode>(InstNode::nodeSizeOfOpCapacity(opCapacity));
  if (ASMJIT_UNLIKELY(!node))
    return reportError(DebugUtils::errored(kErrorOutOfMemory));

  *out = new(node) InstNode(this, instId, instOptions, opCount, opCapacity);
  return kErrorOk;
}